

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall mocker::RenameASTDeclarations::operator()(RenameASTDeclarations *this,ASTRoot *node)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *node_00;
  shared_ptr<mocker::ast::ASTNode> local_b0;
  shared_ptr<mocker::ast::Declaration> local_a0;
  reference local_90;
  shared_ptr<mocker::ast::Declaration> *decl_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
  *__range2_1;
  undefined1 local_60 [8];
  shared_ptr<mocker::ast::VarDecl> p;
  shared_ptr<mocker::ast::Declaration> *decl;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
  *__range2;
  vector<std::shared_ptr<mocker::ast::VarDecl>,_std::allocator<std::shared_ptr<mocker::ast::VarDecl>_>_>
  globalVars;
  ASTRoot *node_local;
  RenameASTDeclarations *this_local;
  
  globalVars.
  super__Vector_base<std::shared_ptr<mocker::ast::VarDecl>,_std::allocator<std::shared_ptr<mocker::ast::VarDecl>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)node;
  std::
  vector<std::shared_ptr<mocker::ast::VarDecl>,_std::allocator<std::shared_ptr<mocker::ast::VarDecl>_>_>
  ::vector((vector<std::shared_ptr<mocker::ast::VarDecl>,_std::allocator<std::shared_ptr<mocker::ast::VarDecl>_>_>
            *)&__range2);
  p_Var2 = &globalVars.
            super__Vector_base<std::shared_ptr<mocker::ast::VarDecl>,_std::allocator<std::shared_ptr<mocker::ast::VarDecl>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage[1].
            super___shared_ptr<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  __end2 = std::
           vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
           ::begin((vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
                    *)p_Var2);
  decl = (shared_ptr<mocker::ast::Declaration> *)
         std::
         vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
         ::end((vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
                *)p_Var2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::shared_ptr<mocker::ast::Declaration>_*,_std::vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>_>
                                     *)&decl), bVar1) {
    p.super___shared_ptr<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<std::shared_ptr<mocker::ast::Declaration>_*,_std::vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>_>
         ::operator*(&__end2);
    std::dynamic_pointer_cast<mocker::ast::VarDecl,mocker::ast::Declaration>
              ((shared_ptr<mocker::ast::Declaration> *)local_60);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_60);
    if (bVar1) {
      node_00 = std::
                __shared_ptr_access<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_60);
      renameGlobalVar(this,node_00);
    }
    std::shared_ptr<mocker::ast::VarDecl>::~shared_ptr((shared_ptr<mocker::ast::VarDecl> *)local_60)
    ;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<mocker::ast::Declaration>_*,_std::vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>_>
    ::operator++(&__end2);
  }
  p_Var2 = &globalVars.
            super__Vector_base<std::shared_ptr<mocker::ast::VarDecl>,_std::allocator<std::shared_ptr<mocker::ast::VarDecl>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage[1].
            super___shared_ptr<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  __end2_1 = std::
             vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
             ::begin((vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
                      *)p_Var2);
  decl_1 = (shared_ptr<mocker::ast::Declaration> *)
           std::
           vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
           ::end((vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
                  *)p_Var2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<std::shared_ptr<mocker::ast::Declaration>_*,_std::vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>_>
                             *)&decl_1), bVar1) {
    local_90 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<mocker::ast::Declaration>_*,_std::vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>_>
               ::operator*(&__end2_1);
    std::dynamic_pointer_cast<mocker::ast::VarDecl,mocker::ast::Declaration>(&local_a0);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_a0);
    std::shared_ptr<mocker::ast::VarDecl>::~shared_ptr
              ((shared_ptr<mocker::ast::VarDecl> *)&local_a0);
    if (!bVar1) {
      std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Declaration,void>
                (&local_b0,local_90);
      visit(this,&local_b0);
      std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_b0);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<mocker::ast::Declaration>_*,_std::vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>_>
    ::operator++(&__end2_1);
  }
  std::
  vector<std::shared_ptr<mocker::ast::VarDecl>,_std::allocator<std::shared_ptr<mocker::ast::VarDecl>_>_>
  ::~vector((vector<std::shared_ptr<mocker::ast::VarDecl>,_std::allocator<std::shared_ptr<mocker::ast::VarDecl>_>_>
             *)&__range2);
  return;
}

Assistant:

void operator()(ast::ASTRoot &node) const override {
    std::vector<std::shared_ptr<ast::VarDecl>> globalVars;
    for (auto &decl : node.decls)
      if (auto p = std::dynamic_pointer_cast<ast::VarDecl>(decl))
        renameGlobalVar(*p);

    for (auto &decl : node.decls) {
      if (std::dynamic_pointer_cast<ast::VarDecl>(decl))
        continue;
      visit(decl);
    }
  }